

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

bool __thiscall jbcoin::STAmount::isEquivalent(STAmount *this,STBase *t)

{
  bool bVar1;
  STAmount *lhs;
  
  lhs = (STAmount *)__dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  if (lhs != (STAmount *)0x0) {
    bVar1 = jbcoin::operator==(lhs,this);
    return bVar1;
  }
  return false;
}

Assistant:

bool
STAmount::isEquivalent (const STBase& t) const
{
    const STAmount* v = dynamic_cast<const STAmount*> (&t);
    return v && (*v == *this);
}